

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingIndex.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1d88::RingIndexTest_RingIndexF_Test::TestBody
          (RingIndexTest_RingIndexF_Test *this)

{
  bool bVar1;
  long *plVar2;
  char *pcVar3;
  RingIndex ret;
  AssertionResult gtest_ar;
  AssertHelper local_48;
  RingIndex local_40;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  RingIndex local_20;
  
  local_20.idx_max = 0x100;
  local_20.idx = 0;
  local_40.idx_max = (RawType)&DAT_00000100;
  local_40.idx = 0;
  testing::internal::CmpHelperEQ<Sledge::RingIndex,Sledge::RingIndex>
            (local_30,"ri + ri.get_max()","ri",&local_40,&local_20);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_40.idx_max != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_40.idx_max != (long *)0x0)) {
        (**(code **)(*(long *)local_40.idx_max + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_20.idx_max = 0x7fffffffffffffff;
    local_20.idx = 0xa3d70a3d70a3d7;
    local_40.idx_max = 0x7fffffffffffffff;
    local_40.idx = 0xa3d70a3d70a3ed;
    local_48.data_ = (AssertHelperData *)0xa3d70a3d70a3ed;
    testing::internal::CmpHelperEQ<Sledge::RingIndex,unsigned_long>
              (local_30,"ri + (max + 22)","ri.get() + 22",&local_40,(unsigned_long *)&local_48);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                 ,0x61,pcVar3);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if ((long *)local_40.idx_max != (long *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)local_40.idx_max != (long *)0x0)) {
          (**(code **)(*(long *)local_40.idx_max + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_40.idx_max = local_20.idx_max;
      plVar2 = (long *)0x0;
      if (0x7fffffffffff9bc2 < local_20.idx) {
        plVar2 = (long *)local_20.idx_max;
      }
      local_40.idx = ((local_20.idx + 0x800000000000643d) - (long)plVar2) % local_20.idx_max;
      local_48.data_ = (AssertHelperData *)(local_20.idx + 0x643e);
      testing::internal::CmpHelperEQ<Sledge::RingIndex,unsigned_long>
                (local_30,"ri + (max + 25662)","ri.get() + 25662",&local_40,
                 (unsigned_long *)&local_48);
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                   ,0x62,pcVar3);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if ((long *)local_40.idx_max != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_40.idx_max != (long *)0x0)) {
            (**(code **)(*(long *)local_40.idx_max + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_40.idx_max = local_20.idx_max;
        local_48.data_ = (AssertHelperData *)(local_20.idx + 0x1c5);
        plVar2 = (long *)0x0;
        if (0xfffffffffffffe3a < local_20.idx) {
          plVar2 = (long *)local_20.idx_max;
        }
        local_40.idx = ((local_20.idx - (long)plVar2) + 0x1c5) % local_20.idx_max;
        testing::internal::CmpHelperEQ<Sledge::RingIndex,unsigned_long>
                  (local_30,"ri + 453","ri.get() + 453",&local_40,(unsigned_long *)&local_48);
        if (local_30[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          if (local_28.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_28.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                     ,99,pcVar3);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if ((long *)local_40.idx_max != (long *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && ((long *)local_40.idx_max != (long *)0x0)) {
              (**(code **)(*(long *)local_40.idx_max + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_20.idx_max = 0xffffffffffffff2c;
          local_20.idx = 0xd3;
          local_40.idx_max = (RawType)&DAT_000000d3;
          testing::internal::CmpHelperEQ<Sledge::RingIndex,unsigned_long>
                    (local_30,"ri","RingIndex::LIMIT_MAX % ri.get_max()",&local_20,&local_40.idx_max
                    );
          if (local_30[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_40);
            if (local_28.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((local_28.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                       ,0x68,pcVar3);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            if ((long *)local_40.idx_max != (long *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && ((long *)local_40.idx_max != (long *)0x0)) {
                (**(code **)(*(long *)local_40.idx_max + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_28,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_28,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_20.idx = 0;
            local_40.idx_max = local_40.idx_max & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<Sledge::RingIndex,int>
                      (local_30,"ri","0",&local_20,(int *)&local_40);
            if (local_30[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_40);
              if (local_28.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = ((local_28.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
                         ,0x6b,pcVar3);
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
              testing::internal::AssertHelper::~AssertHelper(&local_48);
              if ((long *)local_40.idx_max != (long *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) && ((long *)local_40.idx_max != (long *)0x0)) {
                  (**(code **)(*(long *)local_40.idx_max + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_28,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST( RingIndexTest, RingIndexF)
	{
		RingIndex ri(0,256);
		ASSERT_EQ( ri + ri.get_max(), ri);
		
		auto max = RingIndex::LIMIT_MAX / 2;
		ri.set_max(max);
		ri.set( max / 200 );  // value much less than max 
		ASSERT_EQ( ri + (max + 22), ri.get() + 22 );
		ASSERT_EQ( ri + (max + 25662), ri.get() + 25662 );
		ASSERT_EQ( ri + 453, ri.get() + 453 );  // no overflow
		
		ri.set_max( RingIndex::LIMIT_MAX - 211 );
		ri = 0; 
		ri += RingIndex::LIMIT_MAX;
		ASSERT_EQ( ri, RingIndex::LIMIT_MAX % ri.get_max() );
		
		ri.set( ri.get_max() );
		ASSERT_EQ( ri, 0 );
	}